

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

bool slang::syntax::ParameterDeclarationBaseSyntax::isKind(SyntaxKind kind)

{
  return kind == TypeParameterDeclaration || kind == ParameterDeclaration;
}

Assistant:

bool ParameterDeclarationBaseSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::ParameterDeclaration:
        case SyntaxKind::TypeParameterDeclaration:
            return true;
        default:
            return false;
    }
}